

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.cpp
# Opt level: O0

Matrix maths::Matrix::bandSolve(Matrix *A,Matrix *b,int k)

{
  double dVar1;
  long lVar2;
  bool bVar3;
  domain_error *this;
  int in_ECX;
  Matrix *in_RDX;
  double **ppdVar4;
  int *in_RSI;
  int *in_RDI;
  Matrix MVar5;
  int j_1;
  int sum;
  int i_1;
  int k_1;
  int j;
  int i;
  int bandsBelow;
  Matrix *x;
  undefined8 in_stack_ffffffffffffff88;
  int local_4c;
  int local_48;
  int local_44;
  int local_3c;
  int local_38;
  int local_24;
  
  local_24 = 0;
  while( true ) {
    if (*in_RSI <= local_24) {
      Matrix(in_RDX,(int)((ulong)in_stack_ffffffffffffff88 >> 0x20),(int)in_stack_ffffffffffffff88);
      ppdVar4 = (double **)(long)(*in_RDI + -1);
      **(double **)(*(long *)(in_RDI + 2) + (long)ppdVar4 * 8) =
           *in_RDX->p[*in_RDI + -1] /
           *(double *)
            (*(long *)(*(long *)(in_RSI + 2) + (long)(*in_RDI + -1) * 8) + (long)(*in_RDI + -1) * 8)
      ;
      for (local_44 = *in_RDI + -2; -1 < local_44; local_44 = local_44 + -1) {
        local_48 = 0;
        local_4c = local_44;
        while (local_4c = local_4c + 1, local_4c < *in_RDI) {
          local_48 = (int)(*(double *)
                            (*(long *)(*(long *)(in_RSI + 2) + (long)local_44 * 8) +
                            (long)local_4c * 8) *
                           **(double **)(*(long *)(in_RDI + 2) + (long)local_4c * 8) +
                          (double)local_48);
        }
        ppdVar4 = (double **)(long)local_44;
        **(double **)(*(long *)(in_RDI + 2) + (long)local_44 * 8) =
             (*in_RDX->p[local_44] - (double)local_48) /
             *(double *)(*(long *)(*(long *)(in_RSI + 2) + (long)local_44 * 8) + (long)ppdVar4 * 8);
      }
      MVar5.p = ppdVar4;
      MVar5._0_8_ = in_RDI;
      return MVar5;
    }
    dVar1 = *(double *)(*(long *)(*(long *)(in_RSI + 2) + (long)local_24 * 8) + (long)local_24 * 8);
    local_38 = local_24;
    if ((dVar1 == 0.0) && (!NAN(dVar1))) break;
    while (local_38 = local_38 + 1, local_3c = local_24,
          local_38 < *in_RSI && local_38 <= local_24 + (in_ECX + -1) / 2) {
      while( true ) {
        local_3c = local_3c + 1;
        bVar3 = false;
        if (local_3c < in_RSI[1]) {
          bVar3 = *(double *)
                   (*(long *)(*(long *)(in_RSI + 2) + (long)local_38 * 8) + (long)local_3c * 8) !=
                  0.0;
        }
        if (!bVar3) break;
        lVar2 = *(long *)(*(long *)(in_RSI + 2) + (long)local_38 * 8);
        *(double *)(lVar2 + (long)local_3c * 8) =
             -*(double *)
               (*(long *)(*(long *)(in_RSI + 2) + (long)local_24 * 8) + (long)local_3c * 8) *
             (*(double *)
               (*(long *)(*(long *)(in_RSI + 2) + (long)local_38 * 8) + (long)local_24 * 8) /
             *(double *)(*(long *)(*(long *)(in_RSI + 2) + (long)local_24 * 8) + (long)local_24 * 8)
             ) + *(double *)(lVar2 + (long)local_3c * 8);
      }
      *in_RDX->p[local_38] =
           -*in_RDX->p[local_24] *
           (*(double *)(*(long *)(*(long *)(in_RSI + 2) + (long)local_38 * 8) + (long)local_24 * 8)
           / *(double *)(*(long *)(*(long *)(in_RSI + 2) + (long)local_24 * 8) + (long)local_24 * 8)
           ) + *in_RDX->p[local_38];
      *(undefined8 *)(*(long *)(*(long *)(in_RSI + 2) + (long)local_38 * 8) + (long)local_24 * 8) =
           0;
    }
    local_24 = local_24 + 1;
  }
  this = (domain_error *)__cxa_allocate_exception(0x10);
  std::domain_error::domain_error
            (this,
             "Error: the coefficient matrix has 0 as a pivot. Please fix the input and try again.");
  __cxa_throw(this,&std::domain_error::typeinfo,std::domain_error::~domain_error);
}

Assistant:

Matrix Matrix::bandSolve(Matrix A, Matrix b, int k)
{
    // optimized Gaussian elimination
    int bandsBelow = (k - 1) / 2;
    for (int i = 0; i < A.rows_; ++i) {
        if (A.p[i][i] == 0) {
            // pivot 0 - throw exception
            throw domain_error("Error: the coefficient matrix has 0 as a pivot. Please fix the input and try again.");
        }
        for (int j = i + 1; j < A.rows_ && j <= i + bandsBelow; ++j) {
            int k = i + 1;
            while (k < A.cols_ && A.p[j][k]) {
                A.p[j][k] -= A.p[i][k] * (A.p[j][i] / A.p[i][i]);
                k++;
            }
            b.p[j][0] -= b.p[i][0] * (A.p[j][i] / A.p[i][i]);
            A.p[j][i] = 0;
        }
    }

    // Back substitution
    Matrix x(b.rows_, 1);
    x.p[x.rows_ - 1][0] = b.p[x.rows_ - 1][0] / A.p[x.rows_ - 1][x.rows_ - 1];
    for (int i = x.rows_ - 2; i >= 0; --i) {
        int sum = 0;
        for (int j = i + 1; j < x.rows_; ++j) {
            sum += A.p[i][j] * x.p[j][0];
        }
        x.p[i][0] = (b.p[i][0] - sum) / A.p[i][i];
    }

    return x;
}